

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall
HighsCliqueTable::rebuild
          (HighsCliqueTable *this,HighsInt ncols,HighsPostsolveStack *postSolveStack,
          HighsDomain *globaldomain,vector<int,_std::allocator<int>_> *orig2reducedcol,
          vector<int,_std::allocator<int>_> *orig2reducedrow)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  pointer pCVar4;
  ulong uVar5;
  long lVar6;
  HighsInt numcliquevars;
  ulong uVar7;
  pointer pCVar8;
  CliqueVar CVar9;
  pointer pCVar10;
  CliqueVar *pCVar11;
  CliqueVar *pCVar12;
  long lVar13;
  ulong uVar14;
  HighsCliqueTable newCliqueTable;
  HighsCliqueTable HStack_218;
  
  HighsCliqueTable(&HStack_218,ncols);
  HStack_218.inPresolve = this->inPresolve;
  HStack_218.minEntriesForParallelism = this->minEntriesForParallelism;
  uVar5 = ((long)(this->cliques).
                 super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->cliques).
                 super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  if ((int)uVar5 != 0) {
    uVar14 = 0;
    do {
      lVar6 = (long)(this->cliques).
                    super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar14].start;
      if (lVar6 != -1) {
        while( true ) {
          pCVar4 = (this->cliques).
                   super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar3 = pCVar4[uVar14].end;
          if ((int)lVar6 == iVar3) break;
          pCVar10 = (this->cliqueentries).
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          CVar9 = pCVar10[lVar6];
          uVar2 = (orig2reducedcol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[(uint)CVar9 & 0x7fffffff];
          lVar13 = (long)(int)uVar2;
          if ((((lVar13 == -1) ||
               ((globaldomain->mipsolver->model_->integrality_).
                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                super__Vector_impl_data._M_start[lVar13] == kContinuous)) ||
              (dVar1 = (globaldomain->col_lower_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar13], dVar1 != 0.0)) ||
             (((NAN(dVar1) ||
               (dVar1 = (globaldomain->col_upper_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar13], dVar1 != 1.0)) ||
              ((NAN(dVar1) ||
               ((postSolveStack->linearlyTransformable).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar13] == '\0')))))) {
            CVar9 = (CliqueVar)((uint)CVar9 | 0x7fffffff);
          }
          else {
            CVar9 = (CliqueVar)((uint)CVar9 & 0x80000000 | uVar2 & 0x7fffffff);
          }
          pCVar10[lVar6] = CVar9;
          lVar6 = lVar6 + 1;
        }
        pCVar8 = (this->cliqueentries).
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = (long)pCVar4[uVar14].start;
        pCVar10 = pCVar8 + lVar13;
        pCVar12 = pCVar8 + iVar3;
        uVar7 = (long)iVar3 * 4 + lVar13 * -4;
        lVar6 = (long)uVar7 >> 4;
        if (0 < lVar6) {
          pCVar10 = (pointer)((long)&pCVar10->field_0x0 + (uVar7 & 0xfffffffffffffff0));
          lVar6 = lVar6 + 1;
          pCVar8 = pCVar8 + lVar13 + 2;
          do {
            if ((~(uint)pCVar8[-2] & 0x7fffffff) == 0) {
              pCVar8 = pCVar8 + -2;
              goto LAB_00267e2c;
            }
            if ((~(uint)pCVar8[-1] & 0x7fffffff) == 0) {
              pCVar8 = pCVar8 + -1;
              goto LAB_00267e2c;
            }
            if ((~(uint)*pCVar8 & 0x7fffffff) == 0) goto LAB_00267e2c;
            if ((~(uint)pCVar8[1] & 0x7fffffff) == 0) {
              pCVar8 = pCVar8 + 1;
              goto LAB_00267e2c;
            }
            lVar6 = lVar6 + -1;
            pCVar8 = pCVar8 + 4;
          } while (1 < lVar6);
        }
        lVar6 = (long)pCVar12 - (long)pCVar10 >> 2;
        if (lVar6 == 1) {
LAB_00267e09:
          pCVar8 = pCVar10;
          if ((~(uint)*pCVar10 & 0x7fffffff) != 0) {
            pCVar8 = pCVar12;
          }
        }
        else if (lVar6 == 2) {
LAB_00267df9:
          pCVar8 = pCVar10;
          if ((~(uint)*pCVar10 & 0x7fffffff) != 0) {
            pCVar10 = pCVar10 + 1;
            goto LAB_00267e09;
          }
        }
        else {
          pCVar8 = pCVar12;
          if ((lVar6 == 3) && (pCVar8 = pCVar10, (~(uint)*pCVar10 & 0x7fffffff) != 0)) {
            pCVar10 = pCVar10 + 1;
            goto LAB_00267df9;
          }
        }
LAB_00267e2c:
        pCVar11 = pCVar8;
        if (pCVar8 != pCVar12) {
          while (pCVar11 = pCVar11 + 1, pCVar11 != pCVar12) {
            if ((~(uint)*pCVar11 & 0x7fffffff) != 0) {
              *pCVar8 = *pCVar11;
              pCVar8 = pCVar8 + 1;
            }
          }
        }
        pCVar4 = (this->cliques).
                 super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pCVar12 = (this->cliqueentries).
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_start + pCVar4[uVar14].start;
        numcliquevars = (HighsInt)((ulong)((long)pCVar8 - (long)pCVar12) >> 2);
        if (1 < numcliquevars) {
          doAddClique(&HStack_218,pCVar12,numcliquevars,false,
                      (uint)(pCVar4[uVar14].origin != 0x7fffffff) << 0x1f | 0x7fffffff);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uVar5 & 0xffffffff));
  }
  operator=(this,&HStack_218);
  ~HighsCliqueTable(&HStack_218);
  return;
}

Assistant:

void HighsCliqueTable::rebuild(
    HighsInt ncols, const presolve::HighsPostsolveStack& postSolveStack,
    const HighsDomain& globaldomain,
    const std::vector<HighsInt>& orig2reducedcol,
    const std::vector<HighsInt>& orig2reducedrow) {
  HighsCliqueTable newCliqueTable(ncols);
  newCliqueTable.setPresolveFlag(inPresolve);
  newCliqueTable.setMinEntriesForParallelism(minEntriesForParallelism);
  HighsInt ncliques = cliques.size();
  for (HighsInt i = 0; i != ncliques; ++i) {
    if (cliques[i].start == -1) continue;

    for (HighsInt k = cliques[i].start; k != cliques[i].end; ++k) {
      HighsInt col = orig2reducedcol[cliqueentries[k].col];

      if (col == -1 || !globaldomain.isBinary(col) ||
          !postSolveStack.isColLinearlyTransformable(col))
        cliqueentries[k].col = kHighsIInf;
      else
        cliqueentries[k].col = col;
    }

    auto newend =
        std::remove_if(cliqueentries.begin() + cliques[i].start,
                       cliqueentries.begin() + cliques[i].end,
                       [](CliqueVar v) { return v.col == kHighsIInf; });
    HighsInt numvars = newend - (cliqueentries.begin() + cliques[i].start);
    // since we do not know how variables in the clique that have been deleted
    // are replaced (i.e. are they fixed to 0 or 1, or substituted) we relax
    // them out which means the equality status needs to be set to false
    if (numvars <= 1) continue;

    HighsInt origin = cliques[i].origin != kHighsIInf ? -1 : kHighsIInf;
    newCliqueTable.doAddClique(&cliqueentries[cliques[i].start], numvars, false,
                               origin);
  }

  *this = std::move(newCliqueTable);
}